

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

Status __thiscall
soplex::SLUFactor<double>::change
          (SLUFactor<double> *this,int idx,SVectorBase<double> *subst,SSVectorBase<double> *e)

{
  CLUFactor<double> *this_00;
  double dVar1;
  int iVar2;
  int iVar3;
  pointer __s;
  pointer pdVar4;
  Nonzero<double> *pNVar5;
  Status SVar6;
  int iVar7;
  int *piVar8;
  double *pdVar9;
  long lVar10;
  Real RVar11;
  double dVar12;
  
  if (this->usetup == true) {
    if ((this->super_CLUFactor<double>).l.updateType != 1) {
      iVar7 = (this->eta).super_IdxSet.num;
      pdVar9 = (this->eta).super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      (this->eta).setupStatus = false;
      piVar8 = (this->eta).super_IdxSet.idx;
LAB_001d950c:
      CLUFactor<double>::update(&this->super_CLUFactor<double>,idx,pdVar9,piVar8,iVar7);
      (this->eta).super_IdxSet.num = 0;
      (this->eta).setupStatus = true;
      goto LAB_001d9572;
    }
    iVar7 = (this->forest).super_IdxSet.num;
    pdVar9 = (this->forest).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    (this->forest).setupStatus = false;
    piVar8 = (this->forest).super_IdxSet.idx;
  }
  else {
    this_00 = &this->super_CLUFactor<double>;
    if (e != (SSVectorBase<double> *)0x0) {
      (this->super_CLUFactor<double>).l.updateType = 0;
      CLUFactor<double>::updateNoClear
                (this_00,idx,
                 (e->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start,(e->super_IdxSet).idx,(e->super_IdxSet).num);
      (this->super_CLUFactor<double>).l.updateType = this->uptype;
      goto LAB_001d9572;
    }
    if ((this->super_CLUFactor<double>).l.updateType != 1) {
      __s = (this->vec).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
      pdVar4 = (this->vec).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (__s != pdVar4) {
        memset(__s,0,(long)pdVar4 - (long)__s & 0xfffffffffffffff8);
      }
      iVar7 = subst->memused;
      if (0 < (long)iVar7) {
        pNVar5 = subst->m_elem;
        lVar10 = 0;
        do {
          __s[*(int *)((long)&pNVar5->idx + lVar10)] = *(double *)((long)&pNVar5->val + lVar10);
          lVar10 = lVar10 + 0x10;
        } while ((long)iVar7 * 0x10 != lVar10);
      }
      SSVectorBase<double>::clear(&this->eta);
      (this->eta).setupStatus = false;
      CLUFactor<double>::solveRight
                (this_00,(this->eta).super_VectorBase<double>.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                 (this->vec).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
      iVar7 = (this->eta).super_IdxSet.num;
      pdVar9 = (this->eta).super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      (this->eta).setupStatus = false;
      piVar8 = (this->eta).super_IdxSet.idx;
      goto LAB_001d950c;
    }
    SSVectorBase<double>::clear(&this->forest);
    iVar7 = subst->memused;
    (this->forest).super_IdxSet.num = 0;
    if ((long)iVar7 < 1) {
      pdVar9 = (this->forest).super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
    }
    else {
      lVar10 = 0;
      do {
        iVar2 = *(int *)((long)&subst->m_elem->idx + lVar10);
        dVar1 = *(double *)((long)&subst->m_elem->val + lVar10);
        RVar11 = Tolerances::epsilon((this->forest)._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        pdVar9 = (this->forest).super_VectorBase<double>.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        dVar12 = 0.0;
        if (RVar11 < ABS(dVar1)) {
          piVar8 = (this->forest).super_IdxSet.idx;
          iVar3 = (this->forest).super_IdxSet.num;
          (this->forest).super_IdxSet.num = iVar3 + 1;
          piVar8[iVar3] = iVar2;
          dVar12 = dVar1;
        }
        pdVar9[iVar2] = dVar12;
        lVar10 = lVar10 + 0x10;
      } while ((long)iVar7 * 0x10 != lVar10);
    }
    (this->forest).setupStatus = false;
    CLUFactor<double>::solveLright(this_00,pdVar9);
    (this->forest).setupStatus = false;
    pdVar9 = (this->forest).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    iVar7 = 0;
    piVar8 = (int *)0x0;
  }
  CLUFactor<double>::forestUpdate(&this->super_CLUFactor<double>,idx,pdVar9,iVar7,piVar8);
  (this->forest).super_IdxSet.num = 0;
  (this->forest).setupStatus = true;
LAB_001d9572:
  this->usetup = false;
  (*(this->super_SLinSolver<double>)._vptr_SLinSolver[6])(this);
  SVar6 = (*(this->super_SLinSolver<double>)._vptr_SLinSolver[1])(this);
  return SVar6;
}

Assistant:

typename SLUFactor<R>::Status SLUFactor<R>::change(
   int             idx,
   const SVectorBase<R>&  subst,
   const SSVectorBase<R>* e)
{

   // BH 2005-08-23: The boolean usetup indicates that an "update VectorBase<R>"
   // has been set up. I suppose that SSVectorBase<R>  forest is this
   // update VectorBase<R>, which is set up by solveRight4update() and
   // solve2right4update() in order to optimize the basis update.

   if(usetup)
   {
      if(this->l.updateType == FOREST_TOMLIN)               // FOREST_TOMLIN updates
      {
         // BH 2005-08-19: The size of a SSVectorBase<R>  is the size of the
         // index set, i.e.  the number of nonzeros which is only
         // defined if the SSVectorBase<R>  is set up.  Since
         // SSVectorBase<R> ::altValues() calls unSetup() the size needs to be
         // stored before the following call.
         int fsize = forest.size(); // see altValues()
         this->forestUpdate(idx, forest.altValues(), fsize, forest.altIndexMem());
         forest.setSize(0);
         forest.forceSetup();
      }
      else
      {
         assert(this->l.updateType == ETA);
         changeEta(idx, eta);
      }
   }
   else if(e != nullptr)                                    // ETA updates
   {
      this->l.updateType = ETA;
      this->updateNoClear(idx, e->values(), e->indexMem(), e->size());
      this->l.updateType = uptype;
   }
   else if(this->l.updateType == FOREST_TOMLIN)             // FOREST_TOMLIN updates
   {
      assert(0);  // probably this part is never called.
      // forestUpdate() with the last parameter set to NULL should fail.
      forest = subst;
      CLUFactor<R>::solveLright(forest.altValues());
      this->forestUpdate(idx, forest.altValues(), 0, nullptr);
      forest.setSize(0);
      forest.forceSetup();
   }
   else                                               // ETA updates
   {
      assert(this->l.updateType == ETA);
      vec = subst;
      eta.clear();
      CLUFactor<R>::solveRight(eta.altValues(), vec.get_ptr());
      changeEta(idx, eta);
   }

   usetup = false;

   SPxOut::debug(this, "DSLUFA01\tupdated\t\tstability = {}\n", stability());

   return status();
}